

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall sptk::reaper::EpochTracker::CleanUp(EpochTracker *this)

{
  long lVar1;
  pointer pTVar2;
  pointer pfVar3;
  pointer pRVar4;
  size_t j;
  ulong uVar5;
  ulong uVar6;
  
  pRVar4 = (this->resid_peaks_).
           super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->resid_peaks_).
                             super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4) / 0x70);
      uVar6 = uVar6 + 1) {
    for (uVar5 = 0;
        lVar1 = *(long *)&pRVar4[uVar6].future.
                          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                          ._M_impl,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&pRVar4[uVar6].future.
                                       super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                       ._M_impl + 8) - lVar1 >> 3); uVar5 = uVar5 + 1) {
      operator_delete(*(void **)(lVar1 + uVar5 * 8));
      pRVar4 = (this->resid_peaks_).
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::clear(&this->resid_peaks_);
  pTVar2 = (this->output_).
           super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->output_).
      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    (this->output_).
    super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  pfVar3 = (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar3;
  }
  return;
}

Assistant:

void EpochTracker::CleanUp(void) {
  for (size_t i = 0; i < resid_peaks_.size(); ++i) {
    for (size_t j = 0; j < resid_peaks_[i].future.size(); ++j) {
      delete resid_peaks_[i].future[j];
    }
  }
  resid_peaks_.clear();
  output_.clear();
  best_corr_.clear();
}